

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void tidyPrintWindowsLanguageNames(ctmbstr format)

{
  tidyLocaleMapItem *item;
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  char *__format;
  TidyIterator i;
  TidyIterator local_28;
  
  local_28 = getWindowsLanguageList();
  __format = "%-20s -> %s\n";
  if (format != (ctmbstr)0x0) {
    __format = format;
  }
  while (local_28 != (TidyIterator)0x0) {
    item = getNextWindowsLanguage(&local_28);
    ptVar1 = TidyLangWindowsName(item);
    ptVar2 = TidyLangPosixName(item);
    printf(__format,ptVar1,ptVar2);
  }
  return;
}

Assistant:

void tidyPrintWindowsLanguageNames( ctmbstr format )
{
    const tidyLocaleMapItem *item;
    TidyIterator i = getWindowsLanguageList();
    ctmbstr winName;
    ctmbstr posixName;

    while (i) {
        item = getNextWindowsLanguage(&i);
        winName = TidyLangWindowsName( item );
        posixName = TidyLangPosixName( item );
        if ( format )
            printf( format, winName, posixName );
        else
            printf( "%-20s -> %s\n", winName, posixName );
    }
}